

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_free(nk_text_edit *state)

{
  void *pvVar1;
  nk_plugin_free p_Var2;
  
  if (state != (nk_text_edit *)0x0) {
    pvVar1 = (state->string).buffer.memory.ptr;
    if (((pvVar1 != (void *)0x0) && ((state->string).buffer.type != NK_BUFFER_FIXED)) &&
       (p_Var2 = (state->string).buffer.pool.free, p_Var2 != (nk_plugin_free)0x0)) {
      (*p_Var2)((state->string).buffer.pool.userdata,pvVar1);
    }
    (state->string).len = 0;
    return;
  }
  __assert_fail("state",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x57d4,"void nk_textedit_free(struct nk_text_edit *)");
}

Assistant:

NK_API void
nk_textedit_free(struct nk_text_edit *state)
{
    NK_ASSERT(state);
    if (!state) return;
    nk_str_free(&state->string);
}